

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::DoubleParameter::~DoubleParameter(DoubleParameter *this)

{
  ~DoubleParameter(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

DoubleParameter::~DoubleParameter() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.DoubleParameter)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}